

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O1

void __thiscall gdsSREF::reset(gdsSREF *this)

{
  std::__cxx11::string::_M_replace
            ((ulong)&this->name,0,(char *)(this->name)._M_string_length,0x11786a);
  (this->sref_flags).super__Base_bitset<1UL>._M_w = 0;
  this->reflection = false;
  this->angle = 0.0;
  this->xCor = 0;
  this->yCor = 0;
  this->scale = 1.0;
  this->propattr = 0;
  std::__cxx11::string::_M_replace
            ((ulong)&this->propvalue,0,(char *)(this->propvalue)._M_string_length,0x11786a);
  return;
}

Assistant:

void gdsSREF::reset()
{
  name = "\0";
  sref_flags.reset();
  reflection = false;
  angle = 0;
  scale = 1;
  xCor = 0;
  yCor = 0;
  propattr = 0;
  propvalue = "\0";
}